

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

FState * FindState(int statenum)

{
  int iVar1;
  long lVar2;
  
  if ((statenum == 0) || ((ulong)StateMap.Count == 0)) {
    return (FState *)0x0;
  }
  iVar1 = 1;
  lVar2 = 0;
  while ((statenum < iVar1 ||
         (*(int *)((long)&(StateMap.Array)->StateSpan + lVar2) + iVar1 <= statenum))) {
    iVar1 = iVar1 + *(int *)((long)&(StateMap.Array)->StateSpan + lVar2);
    lVar2 = lVar2 + 0x20;
    if ((ulong)StateMap.Count << 5 == lVar2) {
      return (FState *)0x0;
    }
  }
  if (*(long *)((long)&(StateMap.Array)->State + lVar2) != 0) {
    if ((&(StateMap.Array)->OwnerIsPickup)[lVar2] == true) {
      PushTouchedActor(*(PClassActor **)((long)&(StateMap.Array)->Owner + lVar2));
    }
    return (FState *)
           ((long)statenum * 0x28 + *(long *)((long)&(StateMap.Array)->State + lVar2) +
           (long)iVar1 * -0x28);
  }
  return (FState *)0x0;
}

Assistant:

static FState *FindState (int statenum)
{
	int stateacc;
	unsigned i;

	if (statenum == 0)
		return NULL;

	for (i = 0, stateacc = 1; i < StateMap.Size(); i++)
	{
		if (stateacc <= statenum && stateacc + StateMap[i].StateSpan > statenum)
		{
			if (StateMap[i].State != NULL)
			{
				if (StateMap[i].OwnerIsPickup)
				{
					PushTouchedActor(StateMap[i].Owner);
				}
				return StateMap[i].State + statenum - stateacc;
			}
			else return NULL;
		}
		stateacc += StateMap[i].StateSpan;
	}
	return NULL;
}